

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rich_text.cpp
# Opt level: O1

void draw_rich_text_proc(Am_Object *self,Am_Drawonable *drawonable,int x_offset,int y_offset)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Am_Value *pAVar5;
  uint uVar6;
  uint uVar7;
  Am_Text_Viewing_Context vc;
  Am_Value value;
  Am_Text_Viewing_Context local_50;
  Am_Value local_48;
  int local_38;
  int local_34;
  
  local_38 = x_offset;
  local_34 = y_offset;
  pAVar5 = Am_Object::Get(self,100,0);
  iVar1 = Am_Value::operator_cast_to_int(pAVar5);
  pAVar5 = Am_Object::Get(self,0x65,0);
  iVar2 = Am_Value::operator_cast_to_int(pAVar5);
  pAVar5 = Am_Object::Get(self,0x66,0);
  uVar3 = Am_Value::operator_cast_to_int(pAVar5);
  pAVar5 = Am_Object::Get(self,0x67,0);
  uVar4 = Am_Value::operator_cast_to_int(pAVar5);
  local_48.type = 0;
  local_48.value.wrapper_value = (Am_Wrapper *)0x0;
  Am_Object::Make_Unique(self,0x1ee);
  pAVar5 = Am_Object::Get(self,0x1ee,1);
  Am_Value::operator=(&local_48,pAVar5);
  if ((local_48.value.wrapper_value != (Am_Wrapper *)0x0) &&
     (local_48.type == Am_Text_Viewing_Context_Data::id)) {
    Am_Text_Viewing_Context::Am_Text_Viewing_Context(&local_50,&local_48);
    if (local_50.data != (Am_Text_Viewing_Context_Data *)0x0) {
      uVar7 = iVar1 + local_38;
      uVar6 = iVar2 + local_34;
      (*drawonable->_vptr_Am_Drawonable[0x21])
                (drawonable,(ulong)uVar7,(ulong)uVar6,(ulong)uVar3,(ulong)uVar4);
      Am_Text_Viewing_Context_Data::Draw(local_50.data,drawonable,(long)(int)uVar7,(long)(int)uVar6)
      ;
      (*drawonable->_vptr_Am_Drawonable[0x22])(drawonable);
      Am_Text_Viewing_Context::~Am_Text_Viewing_Context(&local_50);
      Am_Value::~Am_Value(&local_48);
      return;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"** Amulet_Error: ",0x11);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Tried to draw an invalid Am_Text_Viewing_Context.",0x31);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
    Am_Error();
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"** Amulet_Error: ",0x11)
  ;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,
             "The slot Am_TEXT_VIEWER does not contain an Am_Text_Viewing_Context.",0x44);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
  Am_Error();
}

Assistant:

Am_Define_Method(Am_Draw_Method, void, draw_rich_text,
                 (Am_Object self, Am_Drawonable *drawonable, int x_offset,
                  int y_offset))
{
  int left = self.Get(Am_LEFT);
  int top = self.Get(Am_TOP);
  int width = self.Get(Am_WIDTH);
  int height = self.Get(Am_HEIGHT);

  Am_Value value;
  self.Make_Unique(Am_TEXT_VIEWER);
  value = self.Peek(Am_TEXT_VIEWER);

  if (!Am_Text_Viewing_Context::Test(value))
    Am_ERRORO(
        "The slot Am_TEXT_VIEWER does not contain an Am_Text_Viewing_Context.",
        self, Am_TEXT_VIEWER);

  Am_Text_Viewing_Context vc = value;
  if (vc.Valid()) {
    drawonable->Push_Clip(x_offset + left, y_offset + top, width, height);
    vc.Draw(drawonable, x_offset + left, y_offset + top);
    drawonable->Pop_Clip();
  } else
    Am_ERRORO("Tried to draw an invalid Am_Text_Viewing_Context.", self,
              Am_TEXT_VIEWER);
}